

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgdata.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  CharList *l;
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  char local_12a;
  char local_129;
  char *local_128;
  char *local_120;
  char *local_110;
  CharList *local_f0;
  char *sp;
  char *cp;
  char *csname;
  int local_d0;
  int32_t len;
  int32_t n;
  uint32_t i;
  UErrorCode status;
  UBool needsHelp;
  CharList *tail;
  UPKGOptions o;
  int result;
  char **argv_local;
  int argc_local;
  
  o.pdsbuild = '\0';
  o._149_3_ = 0;
  i._3_1_ = '\0';
  n = 0;
  progname = *argv;
  options[2].value = "common";
  iVar2 = u_parseArgs(argc,argv,0x16,options);
  if ((options[3].doesOccur == '\0') && (options[4].doesOccur == '\0')) {
    if ((i._3_1_ == '\0') && (iVar2 < 0)) {
      fprintf(_stderr,"%s: error in command line argument \"%s\"\n",progname,argv[-iVar2]);
      fprintf(_stderr,"Run \'%s --help\' for help.\n",progname);
      return 1;
    }
    if (((options[1].doesOccur == '\0') && (iVar4 = strcmp(options[2].value,"common"), iVar4 != 0))
       && (iVar3 = pkg_getOptionsFromICUConfig(options[5].doesOccur,options + 1), iVar3 != 0)) {
      fprintf(_stderr,
              " required parameter is missing: -O is required for static and shared builds.\n");
      fprintf(_stderr,"Run \'%s --help\' for help.\n",progname);
      return 1;
    }
    if (options[0].doesOccur == '\0') {
      fprintf(_stderr," required parameter -p is missing \n");
      fprintf(_stderr,"Run \'%s --help\' for help.\n",progname);
      return 1;
    }
    if (iVar2 == 1) {
      fprintf(_stderr,"No input files specified.\nRun \'%s --help\' for help.\n",progname);
      return 1;
    }
  }
  else {
    i._3_1_ = '\x01';
  }
  if ((iVar2 < 0) || (i._3_1_ != '\0')) {
    fprintf(_stderr,
            "usage: %s [-options] [-] [packageFile] \n\tProduce packaged ICU data from the given list(s) of files.\n\t\'-\' by itself means to read from stdin.\n\tpackageFile is a text file containing the list of files to package.\n"
            ,progname);
    fprintf(_stderr,"\n options:\n");
    for (len = 0; (uint)len < 0x16; len = len + 1) {
      pcVar5 = "";
      if (len == 0) {
        pcVar5 = "[REQ]";
      }
      if (options[(uint)len].longName == (char *)0x0) {
        local_110 = "     ";
      }
      else {
        local_110 = "or --";
      }
      if (options[(uint)len].longName == (char *)0x0) {
        local_120 = "";
      }
      else {
        local_120 = options[(uint)len].longName;
      }
      fprintf(_stderr,"%-5s -%c %s%-10s  %s\n",pcVar5,(ulong)(uint)(int)options[(uint)len].shortName
              ,local_110,local_120,options_help + (uint)len);
    }
    fprintf(_stderr,"modes: (-m option)\n");
    for (len = 0; (uint)len < 3; len = len + 1) {
      fprintf(_stderr,"   %-9s ",modes[(uint)len].name);
      if (modes[(uint)len].alt_name == (char *)0x0) {
        fprintf(_stderr,"           ");
      }
      else {
        fprintf(_stderr,"/ %-9s",modes[(uint)len].alt_name);
      }
      fprintf(_stderr,"  %s\n",modes[(uint)len].desc);
    }
    argv_local._4_4_ = 1;
  }
  else {
    memset(&tail,0,0x98);
    o.options = options[2].value;
    if (options[0xe].doesOccur == '\0') {
      local_128 = (char *)0x0;
    }
    else {
      local_128 = options[0xe].value;
    }
    o.mode = local_128;
    o.outFiles = (CharList *)options[0].value;
    sVar6 = strlen(options[0].value);
    pcVar5 = (char *)uprv_malloc_63((long)((int)sVar6 + 2));
    local_f0 = o.outFiles;
    sp = pcVar5;
    if (*(char *)&(o.outFiles)->str != '\0') {
      iVar4 = isalpha((int)*(char *)&(o.outFiles)->str);
      if (iVar4 == 0) {
        local_129 = '_';
      }
      else {
        local_129 = *(char *)&local_f0->str;
      }
      *pcVar5 = local_129;
      while( true ) {
        sp = sp + 1;
        local_f0 = (CharList *)((long)&local_f0->str + 1);
        if (*(char *)&local_f0->str == '\0') break;
        iVar4 = isalnum((int)*(char *)&local_f0->str);
        if (iVar4 == 0) {
          local_12a = '_';
        }
        else {
          local_12a = *(char *)&local_f0->str;
        }
        *sp = local_12a;
      }
    }
    *sp = '\0';
    if (options[0x10].doesOccur == '\0') {
      o.icuroot = (char *)o.outFiles;
    }
    else {
      o.icuroot = options[0x10].value;
    }
    o.libName._2_1_ = options[0x11].doesOccur != '\0';
    o.shortName = pcVar5;
    if (options[0x13].doesOccur == '\0') {
      o.libName._4_1_ = 0;
    }
    else {
      o.libName._4_1_ = 0;
      fprintf(_stdout,"Warning: You are using the -z option which only works on z/OS.\n");
    }
    o.libName._1_1_ = options[5].doesOccur;
    if (options[1].doesOccur == '\0') {
      o.srcDir = (char *)0x0;
    }
    else {
      o.srcDir = options[1].value;
    }
    if (options[6].doesOccur == '\0') {
      if (options[7].doesOccur != '\0') {
        o.version = options[7].value;
      }
    }
    else {
      o.version = 
      " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
      ;
    }
    if (options[8].doesOccur == '\0') {
      o.entryName = ".";
    }
    else {
      o.entryName = options[8].value;
    }
    o.libName._0_1_ = options[9].doesOccur;
    if (options[10].doesOccur == '\0') {
      o.dataDir = o.entryName;
    }
    else {
      o.dataDir = options[10].value;
    }
    if (options[0xb].doesOccur == '\0') {
      o.comment = (char *)0x0;
    }
    else {
      o.comment = options[0xb].value;
    }
    if (options[0xc].doesOccur == '\0') {
      o.tmpDir = ".";
    }
    else {
      o.tmpDir = options[0xc].value;
    }
    if (options[0xd].doesOccur == '\0') {
      o.cShortName = o.shortName;
    }
    else {
      o.cShortName = options[0xd].value;
    }
    o.libName._3_1_ = options[0x12].doesOccur != '\0';
    _status = (CharList *)0x0;
    for (local_d0 = 1; l = tail, local_d0 < iVar2; local_d0 = local_d0 + 1) {
      pcVar5 = uprv_strdup_63(argv[local_d0]);
      tail = pkg_appendToList(l,(CharList **)&status,pcVar5);
    }
    loadLists((UPKGOptions *)&tail,&n);
    UVar1 = U_FAILURE(n);
    __stream = _stderr;
    if (UVar1 == '\0') {
      o._148_4_ = pkg_executeOptions((UPKGOptions *)&tail);
      if (pkgDataFlags != (char **)0x0) {
        for (local_d0 = 0; local_d0 < 0x11; local_d0 = local_d0 + 1) {
          if (pkgDataFlags[local_d0] != (char *)0x0) {
            uprv_free_63(pkgDataFlags[local_d0]);
          }
        }
        uprv_free_63(pkgDataFlags);
      }
      if (o.shortName != (char *)0x0) {
        uprv_free_63(o.shortName);
      }
      if (tail != (CharList *)0x0) {
        pkg_deleteList(tail);
      }
      if (o.fileListFiles != (CharList *)0x0) {
        pkg_deleteList(o.fileListFiles);
      }
      if (o.filePaths != (CharList *)0x0) {
        pkg_deleteList(o.filePaths);
      }
      argv_local._4_4_ = o._148_4_;
    }
    else {
      pcVar5 = u_errorName_63(n);
      fprintf(__stream,"error loading input file lists: %s\n",pcVar5);
      argv_local._4_4_ = 2;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char* argv[]) {
    int result = 0;
    /* FileStream  *out; */
    UPKGOptions  o;
    CharList    *tail;
    UBool        needsHelp = FALSE;
    UErrorCode   status = U_ZERO_ERROR;
    /* char         tmp[1024]; */
    uint32_t i;
    int32_t n;

    U_MAIN_INIT_ARGS(argc, argv);

    progname = argv[0];

    options[MODE].value = "common";

    /* read command line options */
    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);

    /* error handling, printing usage message */
    /* I've decided to simply print an error and quit. This tool has too
    many options to just display them all of the time. */

    if(options[HELP].doesOccur || options[HELP_QUESTION_MARK].doesOccur) {
        needsHelp = TRUE;
    }
    else {
        if(!needsHelp && argc<0) {
            fprintf(stderr,
                "%s: error in command line argument \"%s\"\n",
                progname,
                argv[-argc]);
            fprintf(stderr, "Run '%s --help' for help.\n", progname);
            return 1;
        }


#if !defined(WINDOWS_WITH_MSVC) || defined(USING_CYGWIN)
        if(!options[BLDOPT].doesOccur && uprv_strcmp(options[MODE].value, "common") != 0) {
          if (pkg_getOptionsFromICUConfig(options[VERBOSE].doesOccur, &options[BLDOPT]) != 0) {
                fprintf(stderr, " required parameter is missing: -O is required for static and shared builds.\n");
                fprintf(stderr, "Run '%s --help' for help.\n", progname);
                return 1;
            }
        }
#else
        if(options[BLDOPT].doesOccur) {
            fprintf(stdout, "Warning: You are using the -O option which is not needed for MSVC build on Windows.\n");
        }
#endif

        if(!options[NAME].doesOccur) /* -O we already have - don't report it. */
        {
            fprintf(stderr, " required parameter -p is missing \n");
            fprintf(stderr, "Run '%s --help' for help.\n", progname);
            return 1;
        }

        if(argc == 1) {
            fprintf(stderr,
                "No input files specified.\n"
                "Run '%s --help' for help.\n", progname);
            return 1;
        }
    }   /* end !needsHelp */

    if(argc<0 || needsHelp  ) {
        fprintf(stderr,
            "usage: %s [-options] [-] [packageFile] \n"
            "\tProduce packaged ICU data from the given list(s) of files.\n"
            "\t'-' by itself means to read from stdin.\n"
            "\tpackageFile is a text file containing the list of files to package.\n",
            progname);

        fprintf(stderr, "\n options:\n");
        for(i=0;i<UPRV_LENGTHOF(options);i++) {
            fprintf(stderr, "%-5s -%c %s%-10s  %s\n",
                (i<1?"[REQ]":""),
                options[i].shortName,
                options[i].longName ? "or --" : "     ",
                options[i].longName ? options[i].longName : "",
                options_help[i]);
        }

        fprintf(stderr, "modes: (-m option)\n");
        for(i=0;i<UPRV_LENGTHOF(modes);i++) {
            fprintf(stderr, "   %-9s ", modes[i].name);
            if (modes[i].alt_name) {
                fprintf(stderr, "/ %-9s", modes[i].alt_name);
            } else {
                fprintf(stderr, "           ");
            }
            fprintf(stderr, "  %s\n", modes[i].desc);
        }
        return 1;
    }

    /* OK, fill in the options struct */
    uprv_memset(&o, 0, sizeof(o));

    o.mode      = options[MODE].value;
    o.version   = options[REVISION].doesOccur ? options[REVISION].value : 0;

    o.shortName = options[NAME].value;
    {
        int32_t len = (int32_t)uprv_strlen(o.shortName);
        char *csname, *cp;
        const char *sp;

        cp = csname = (char *) uprv_malloc((len + 1 + 1) * sizeof(*o.cShortName));
        if (*(sp = o.shortName)) {
            *cp++ = isalpha(*sp) ? * sp : '_';
            for (++sp; *sp; ++sp) {
                *cp++ = isalnum(*sp) ? *sp : '_';
            }
        }
        *cp = 0;

        o.cShortName = csname;
    }

    if(options[LIBNAME].doesOccur) { /* get libname from shortname, or explicit -L parameter */
      o.libName = options[LIBNAME].value;
    } else {
      o.libName = o.shortName;
    }

    if(options[QUIET].doesOccur) {
      o.quiet = TRUE;
    } else {
      o.quiet = FALSE;
    }

    if(options[PDS_BUILD].doesOccur) {
#if U_PLATFORM == U_PF_OS390
      o.pdsbuild = TRUE;
#else
      o.pdsbuild = FALSE;
      fprintf(stdout, "Warning: You are using the -z option which only works on z/OS.\n");

#endif
    } else {
      o.pdsbuild = FALSE;
    }

    o.verbose   = options[VERBOSE].doesOccur;


#if !defined(WINDOWS_WITH_MSVC) || defined(USING_CYGWIN) /* on UNIX, we'll just include the file... */
    if (options[BLDOPT].doesOccur) {
        o.options   = options[BLDOPT].value;
    } else {
        o.options = NULL;
    }
#endif
    if(options[COPYRIGHT].doesOccur) {
        o.comment = U_COPYRIGHT_STRING;
    } else if (options[COMMENT].doesOccur) {
        o.comment = options[COMMENT].value;
    }

    if( options[DESTDIR].doesOccur ) {
        o.targetDir = options[DESTDIR].value;
    } else {
        o.targetDir = ".";  /* cwd */
    }

    o.rebuild   = options[REBUILD].doesOccur;

    if( options[TEMPDIR].doesOccur ) {
        o.tmpDir    = options[TEMPDIR].value;
    } else {
        o.tmpDir    = o.targetDir;
    }

    if( options[INSTALL].doesOccur ) {
        o.install  = options[INSTALL].value;
    } else {
        o.install = NULL;
    }

    if( options[SOURCEDIR].doesOccur ) {
        o.srcDir   = options[SOURCEDIR].value;
    } else {
        o.srcDir   = ".";
    }

    if( options[ENTRYPOINT].doesOccur ) {
        o.entryName = options[ENTRYPOINT].value;
    } else {
        o.entryName = o.cShortName;
    }

    o.withoutAssembly = FALSE;
    if (options[WITHOUT_ASSEMBLY].doesOccur) {
#ifndef BUILD_DATA_WITHOUT_ASSEMBLY
        fprintf(stdout, "Warning: You are using the option to build without assembly code which is not supported on this platform.\n");
        fprintf(stdout, "Warning: This option will be ignored.\n");
#else
        o.withoutAssembly = TRUE;
#endif
    }

    /* OK options are set up. Now the file lists. */
    tail = NULL;
    for( n=1; n<argc; n++) {
        o.fileListFiles = pkg_appendToList(o.fileListFiles, &tail, uprv_strdup(argv[n]));
    }

    /* load the files */
    loadLists(&o, &status);
    if( U_FAILURE(status) ) {
        fprintf(stderr, "error loading input file lists: %s\n", u_errorName(status));
        return 2;
    }

    result = pkg_executeOptions(&o);

    if (pkgDataFlags != NULL) {
        for (n = 0; n < PKGDATA_FLAGS_SIZE; n++) {
            if (pkgDataFlags[n] != NULL) {
                uprv_free(pkgDataFlags[n]);
            }
        }
        uprv_free(pkgDataFlags);
    }

    if (o.cShortName != NULL) {
        uprv_free((char *)o.cShortName);
    }
    if (o.fileListFiles != NULL) {
        pkg_deleteList(o.fileListFiles);
    }
    if (o.filePaths != NULL) {
        pkg_deleteList(o.filePaths);
    }
    if (o.files != NULL) {
        pkg_deleteList(o.files);
    }

    return result;
}